

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeDebugFunctionType
          (Builder *this,Id returnType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes)

{
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  uint typeId;
  Op OVar1;
  uint *puVar2;
  Id IVar3;
  mapped_type_conflict *pmVar4;
  Instruction *this_01;
  Id *pIVar5;
  Id IVar6;
  uint *puVar7;
  size_type __n;
  uint paramType;
  Id local_40;
  Id local_3c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  this_00 = &this->debugId;
  local_3c = returnType;
  pmVar4 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](this_00,&local_3c);
  if (*pmVar4 != 0) {
    IVar6 = this->uniqueId + 1;
    this->uniqueId = IVar6;
    this_01 = (Instruction *)operator_new(0x60);
    IVar3 = makeVoidType(this);
    this_01->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
    this_01->resultId = IVar6;
    this_01->typeId = IVar3;
    this_01->opCode = OpExtInst;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    this_01->block = (Block *)0x0;
    __n = ((long)(paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 2) + 4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_01->operands,__n);
    std::vector<bool,_std::allocator<bool>_>::reserve(&this_01->idOperand,__n);
    Instruction::addIdOperand(this_01,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(this_01,8);
    IVar3 = makeIntegerType(this,0x20,false);
    IVar3 = makeIntConstant(this,IVar3,3,false);
    Instruction::addIdOperand(this_01,IVar3);
    pmVar4 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](this_00,&local_3c);
    Instruction::addIdOperand(this_01,*pmVar4);
    puVar7 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar7 != puVar2) {
      do {
        typeId = *puVar7;
        local_38._M_head_impl._0_4_ = typeId;
        OVar1 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[typeId]->opCode;
        if ((OVar1 == OpTypePointer) || (OVar1 == OpTypeArray)) {
          local_40 = getContainedTypeId(this,typeId,0);
          pIVar5 = std::
                   map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](this_00,&local_40);
        }
        else {
          pIVar5 = std::
                   map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](this_00,(key_type *)&local_38);
        }
        Instruction::addIdOperand(this_01,*pIVar5);
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar2);
    }
    local_38._M_head_impl = this_01;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,this_01);
    return IVar6;
  }
  __assert_fail("debugId[returnType] != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x2a6,"Id spv::Builder::makeDebugFunctionType(Id, const std::vector<Id> &)");
}

Assistant:

Id Builder::makeDebugFunctionType(Id returnType, const std::vector<Id>& paramTypes)
{
    assert(debugId[returnType] != 0);

    Id typeId = getUniqueId();
    auto type = new Instruction(typeId, makeVoidType(), OpExtInst);
    type->reserveOperands(paramTypes.size() + 4);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeFunction);
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic));
    type->addIdOperand(debugId[returnType]);
    for (auto const paramType : paramTypes) {
        if (isPointerType(paramType) || isArrayType(paramType)) {
            type->addIdOperand(debugId[getContainedTypeId(paramType)]);
        }
        else {
            type->addIdOperand(debugId[paramType]);
        }
    }
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    return typeId;
}